

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int __thiscall MlmWrap::initialize(MlmWrap *this)

{
  char *_id;
  bool bVar1;
  zactor_t *pzVar2;
  ostream *poVar3;
  string *this_00;
  allocator local_e9;
  TrodesMsg configReq;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (this->connected == false) {
    _id = (this->id)._M_dataplus._M_p;
    std::__cxx11::string::string((string *)&configReq,(string *)&this->state->endpoint);
    create(this,_id,configReq.format._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&configReq);
    if (this->connected == false) {
      std::__cxx11::string::string((string *)&local_40,"Client could not be initialized!",&local_e9)
      ;
      error(&configReq.format,this,&local_40);
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&configReq);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&configReq);
      this_00 = &local_40;
      goto LAB_00194114;
    }
  }
  if (this->initialized != false) {
    return 0;
  }
  pzVar2 = zactor_new(message_reactor_task,this);
  this->actor = pzVar2;
  if ((pzVar2 != (zactor_t *)0x0) && (this->client != (mlm_client_t *)0x0)) {
    this->initialized = true;
    bVar1 = std::operator!=(&this->id,"Trodes");
    if (!bVar1) {
      return 0;
    }
    bVar1 = std::operator!=(&this->id,"Broker");
    if (!bVar1) {
      return 0;
    }
    std::__cxx11::string::string((string *)&local_60,"s",&local_e9);
    TrodesMsg::TrodesMsg<char_const*>(&configReq,&local_60,"infoConf");
    std::__cxx11::string::~string((string *)&local_60);
    sendMessage(this,"Trodes","info_req",&configReq,"",0);
    std::__cxx11::string::string((string *)&local_80,"infoConf",&local_e9);
    blockforreply(this,&local_80,500);
    std::__cxx11::string::~string((string *)&local_80);
    TrodesMsg::~TrodesMsg(&configReq);
    return 0;
  }
  if (pzVar2 != (zactor_t *)0x0) {
    zactor_destroy(&this->actor);
    std::__cxx11::string::string((string *)&local_a0,"Client could not be initialized!",&local_e9);
    error(&configReq.format,this,&local_a0);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&configReq);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&configReq);
    std::__cxx11::string::~string((string *)&local_a0);
    return -2;
  }
  std::__cxx11::string::string((string *)&local_c0,"Client could not be initialized!",&local_e9);
  error(&configReq.format,this,&local_c0);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&configReq);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&configReq);
  this_00 = &local_c0;
LAB_00194114:
  std::__cxx11::string::~string((string *)this_00);
  return -1;
}

Assistant:

int MlmWrap::initialize(){
    if (!connected){ //if the broker could not be connected to, try again once
        create(id.c_str(), state->getEndpoint().c_str());
        if(!connected){
            std::cerr << error("Client could not be initialized!") << std::endl;
            return -1;
        }
    }

    if(initialized){
        return 0;
    }
    actor = zactor_new(&MlmWrap::message_reactor_task, this);
    if(actor && client){ //both actor and client must be successfully created
        initialized = true;
        if (id != TRODES_NETWORK_ID && id != BROKER_NETWORK_ID) {
            //Request from Trodes the current state object (events, hfdts, and others)
            TrodesMsg configReq("s", INFO_CONFIG);
            sendMessage(TRODES_NETWORK_ID, TRODES_INFO_REQ, configReq);
            blockforreply(INFO_CONFIG, 500);
        }
        return 0;
    }
    else if (actor != NULL) {
        zactor_destroy(&actor);
        std::cerr << error("Client could not be initialized!") << std::endl;
        return -2;
    }
    else{
        std::cerr << error("Client could not be initialized!") << std::endl;
        return -1;
    }
}